

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O3

int deqp::gles31::bb::anon_unknown_11::computeStd430BaseAlignment
              (VarType *type,deUint32 layoutFlags)

{
  int iVar1;
  int iVar2;
  DataType dataType;
  pointer pSVar3;
  
  for (; type->m_type == TYPE_ARRAY; type = (type->m_data).array.elementType) {
  }
  if (type->m_type == TYPE_BASIC) {
    dataType = (type->m_data).basic.type;
    if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
      if ((layoutFlags & 0x10) == 0) {
        iVar1 = glu::getDataTypeMatrixNumRows(dataType);
      }
      else {
        iVar1 = glu::getDataTypeMatrixNumColumns(dataType);
      }
      dataType = glu::getDataTypeFloatVec(iVar1);
    }
    if (dataType - TYPE_FLOAT < 0x26) {
      return *(int *)(&DAT_01c90770 + (ulong)(dataType - TYPE_FLOAT) * 4);
    }
  }
  else {
    pSVar3 = (((type->m_data).structPtr)->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar3 != (((type->m_data).structPtr)->m_members).
                  super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      iVar1 = 0;
      do {
        iVar2 = computeStd430BaseAlignment(&pSVar3->m_type,layoutFlags);
        if (iVar1 <= iVar2) {
          iVar1 = iVar2;
        }
        pSVar3 = pSVar3 + 1;
      } while (pSVar3 != (((type->m_data).structPtr)->m_members).
                         super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int computeStd430BaseAlignment (const VarType& type, deUint32 layoutFlags)
{
	// Otherwise identical to std140 except that alignment of structures and arrays
	// are not rounded up to alignment of vec4.

	if (type.isBasicType())
	{
		glu::DataType basicType = type.getBasicType();

		if (glu::isDataTypeMatrix(basicType))
		{
			const bool	isRowMajor	= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			const int	vecSize		= isRowMajor ? glu::getDataTypeMatrixNumColumns(basicType)
												 : glu::getDataTypeMatrixNumRows(basicType);
			const int	vecAlign	= getDataTypeByteAlignment(glu::getDataTypeFloatVec(vecSize));

			return vecAlign;
		}
		else
			return getDataTypeByteAlignment(basicType);
	}
	else if (type.isArrayType())
	{
		return computeStd430BaseAlignment(type.getElementType(), layoutFlags);
	}
	else
	{
		DE_ASSERT(type.isStructType());

		int maxBaseAlignment = 0;

		for (StructType::ConstIterator memberIter = type.getStructPtr()->begin(); memberIter != type.getStructPtr()->end(); memberIter++)
			maxBaseAlignment = de::max(maxBaseAlignment, computeStd430BaseAlignment(memberIter->getType(), layoutFlags));

		return maxBaseAlignment;
	}
}